

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O0

int __thiscall cmCTestUpdateHandler::DetectVCS(cmCTestUpdateHandler *this,char *dir)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  ostringstream cmCTestLog_msg;
  allocator local_41;
  string local_40 [8];
  string sourceDirectory;
  char *dir_local;
  cmCTestUpdateHandler *this_local;
  
  sourceDirectory.field_2._8_8_ = dir;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,dir,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  poVar2 = std::operator<<((ostream *)local_1d0,"Check directory: ");
  poVar2 = std::operator<<(poVar2,local_40);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,0,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x101,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::__cxx11::string::operator+=(local_40,"/.svn");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar3);
  if (bVar1) {
    this_local._4_4_ = 2;
  }
  else {
    std::__cxx11::string::operator=(local_40,(char *)sourceDirectory.field_2._8_8_);
    std::__cxx11::string::operator+=(local_40,"/CVS");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar1) {
      this_local._4_4_ = 1;
    }
    else {
      std::__cxx11::string::operator=(local_40,(char *)sourceDirectory.field_2._8_8_);
      std::__cxx11::string::operator+=(local_40,"/.bzr");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileExists(pcVar3);
      if (bVar1) {
        this_local._4_4_ = 3;
      }
      else {
        std::__cxx11::string::operator=(local_40,(char *)sourceDirectory.field_2._8_8_);
        std::__cxx11::string::operator+=(local_40,"/.git");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::SystemTools::FileExists(pcVar3);
        if (bVar1) {
          this_local._4_4_ = 4;
        }
        else {
          std::__cxx11::string::operator=(local_40,(char *)sourceDirectory.field_2._8_8_);
          std::__cxx11::string::operator+=(local_40,"/.hg");
          pcVar3 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::SystemTools::FileExists(pcVar3);
          if (bVar1) {
            this_local._4_4_ = 5;
          }
          else {
            std::__cxx11::string::operator=(local_40,(char *)sourceDirectory.field_2._8_8_);
            std::__cxx11::string::operator+=(local_40,"/.p4");
            pcVar3 = (char *)std::__cxx11::string::c_str();
            bVar1 = cmsys::SystemTools::FileExists(pcVar3);
            if (bVar1) {
              this_local._4_4_ = 6;
            }
            else {
              std::__cxx11::string::operator=(local_40,(char *)sourceDirectory.field_2._8_8_);
              std::__cxx11::string::operator+=(local_40,"/.p4config");
              pcVar3 = (char *)std::__cxx11::string::c_str();
              bVar1 = cmsys::SystemTools::FileExists(pcVar3);
              if (bVar1) {
                this_local._4_4_ = 6;
              }
              else {
                this_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_40);
  return this_local._4_4_;
}

Assistant:

int cmCTestUpdateHandler::DetectVCS(const char* dir)
{
  std::string sourceDirectory = dir;
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Check directory: " << sourceDirectory << std::endl,
                     this->Quiet);
  sourceDirectory += "/.svn";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_SVN;
  }
  sourceDirectory = dir;
  sourceDirectory += "/CVS";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_CVS;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.bzr";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_BZR;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.git";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_GIT;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.hg";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_HG;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.p4";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_P4;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.p4config";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_P4;
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}